

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCharType.cpp
# Opt level: O3

void __thiscall hdc::UCharType::UCharType(UCharType *this,Token *token)

{
  int iVar1;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_001966f8;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  iVar1 = token->line;
  (this->token).kind = token->kind;
  (this->token).line = iVar1;
  (this->token).column = token->column;
  std::__cxx11::string::_M_assign((string *)&(this->token).lexem);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_UCHAR_TYPE;
  return;
}

Assistant:

UCharType::UCharType(Token& token) {
    this->token = token;
    this->kind = AST_UCHAR_TYPE;
}